

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_record.c
# Opt level: O3

int main(void)

{
  float fVar1;
  int iVar2;
  PaDeviceInfo *pPVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  PaStream *stream;
  paTestData data;
  PaStreamParameters outputParameters;
  PaStreamParameters inputParameters;
  PaStream *local_80;
  ulong local_78;
  void *local_70;
  double local_68;
  PaStreamParameters local_60;
  PaStreamParameters local_40;
  
  puts("patest_record.c");
  fflush(_stdout);
  local_78 = 0x35d5400000000;
  local_70 = calloc(1,0x1aeaa0);
  if (local_70 == (void *)0x0) {
    puts("Could not allocate record array.");
  }
  else {
    iVar2 = Pa_Initialize();
    if (iVar2 != 0) goto LAB_00107d00;
    local_40.device = Pa_GetDefaultInputDevice();
    if (local_40.device == -1) {
      main_cold_2();
    }
    else {
      local_40.channelCount = 2;
      local_40.sampleFormat = 1;
      pPVar3 = Pa_GetDeviceInfo(local_40.device);
      local_40.suggestedLatency = pPVar3->defaultLowInputLatency;
      local_40.hostApiSpecificStreamInfo = (void *)0x0;
      iVar2 = Pa_OpenStream(&local_80,&local_40,(PaStreamParameters *)0x0,44100.0,0x200,1,
                            recordCallback,&local_78);
      if ((iVar2 != 0) || (iVar2 = Pa_StartStream(local_80), iVar2 != 0)) goto LAB_00107d00;
      puts("\n=== Now recording!! Please speak into the microphone. ===");
      fflush(_stdout);
      iVar2 = Pa_IsStreamActive(local_80);
      while (iVar2 == 1) {
        Pa_Sleep(1000);
        printf("index = %d\n");
        fflush(_stdout);
        iVar2 = Pa_IsStreamActive(local_80);
      }
      if ((iVar2 < 0) || (iVar2 = Pa_CloseStream(local_80), iVar2 != 0)) goto LAB_00107d00;
      fVar5 = 0.0;
      local_68 = 0.0;
      lVar4 = 0;
      do {
        fVar1 = *(float *)((long)local_70 + lVar4 * 4);
        fVar6 = -fVar1;
        if (-fVar1 <= fVar1) {
          fVar6 = fVar1;
        }
        fVar1 = fVar6;
        if (fVar6 <= fVar5) {
          fVar1 = fVar5;
        }
        fVar5 = fVar1;
        local_68 = local_68 + (double)fVar6;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x6baa8);
      local_68 = local_68 / 441000.0;
      printf("sample max amplitude = %.8f\n",(double)fVar5);
      printf("sample average = %lf\n",local_68);
      local_78 = local_78 & 0xffffffff00000000;
      local_60.device = Pa_GetDefaultOutputDevice();
      if (local_60.device == -1) {
        main_cold_1();
      }
      else {
        local_60.channelCount = 2;
        local_60.sampleFormat = 1;
        pPVar3 = Pa_GetDeviceInfo(local_60.device);
        local_60.suggestedLatency = pPVar3->defaultLowOutputLatency;
        local_60.hostApiSpecificStreamInfo = (void *)0x0;
        puts("\n=== Now playing back. ===");
        fflush(_stdout);
        iVar2 = Pa_OpenStream(&local_80,(PaStreamParameters *)0x0,&local_60,44100.0,0x200,1,
                              playCallback,&local_78);
        if ((local_80 == (PaStream *)0x0 || iVar2 != 0) ||
           (iVar2 = Pa_StartStream(local_80), iVar2 != 0)) goto LAB_00107d00;
        puts("Waiting for playback to finish.");
        fflush(_stdout);
        while (iVar2 = Pa_IsStreamActive(local_80), iVar2 == 1) {
          Pa_Sleep(100);
        }
        if ((iVar2 < 0) || (iVar2 = Pa_CloseStream(local_80), iVar2 != 0)) goto LAB_00107d00;
        puts("Done.");
        fflush(_stdout);
      }
    }
  }
  iVar2 = 0;
LAB_00107d00:
  Pa_Terminate();
  if (local_70 != (void *)0x0) {
    free(local_70);
  }
  if (iVar2 != 0) {
    main_cold_3();
  }
  return (uint)(iVar2 != 0);
}

Assistant:

int main(void)
{
    PaStreamParameters  inputParameters,
                        outputParameters;
    PaStream*           stream;
    PaError             err = paNoError;
    paTestData          data;
    int                 i;
    int                 totalFrames;
    int                 numSamples;
    int                 numBytes;
    SAMPLE              max, val;
    double              average;

    printf("patest_record.c\n"); fflush(stdout);

    data.maxFrameIndex = totalFrames = NUM_SECONDS * SAMPLE_RATE; /* Record for a few seconds. */
    data.frameIndex = 0;
    numSamples = totalFrames * NUM_CHANNELS;
    numBytes = numSamples * sizeof(SAMPLE);
    data.recordedSamples = (SAMPLE *) malloc( numBytes ); /* From now on, recordedSamples is initialised. */
    if( data.recordedSamples == NULL )
    {
        printf("Could not allocate record array.\n");
        goto done;
    }
    for( i=0; i<numSamples; i++ ) data.recordedSamples[i] = 0;

    err = Pa_Initialize();
    if( err != paNoError ) goto done;

    inputParameters.device = Pa_GetDefaultInputDevice(); /* default input device */
    if (inputParameters.device == paNoDevice) {
        fprintf(stderr,"Error: No default input device.\n");
        goto done;
    }
    inputParameters.channelCount = 2;                    /* stereo input */
    inputParameters.sampleFormat = PA_SAMPLE_TYPE;
    inputParameters.suggestedLatency = Pa_GetDeviceInfo( inputParameters.device )->defaultLowInputLatency;
    inputParameters.hostApiSpecificStreamInfo = NULL;

    /* Record some audio. -------------------------------------------- */
    err = Pa_OpenStream(
              &stream,
              &inputParameters,
              NULL,                  /* &outputParameters, */
              SAMPLE_RATE,
              FRAMES_PER_BUFFER,
              paClipOff,      /* we won't output out of range samples so don't bother clipping them */
              recordCallback,
              &data );
    if( err != paNoError ) goto done;

    err = Pa_StartStream( stream );
    if( err != paNoError ) goto done;
    printf("\n=== Now recording!! Please speak into the microphone. ===\n"); fflush(stdout);

    while( ( err = Pa_IsStreamActive( stream ) ) == 1 )
    {
        Pa_Sleep(1000);
        printf("index = %d\n", data.frameIndex ); fflush(stdout);
    }
    if( err < 0 ) goto done;

    err = Pa_CloseStream( stream );
    if( err != paNoError ) goto done;

    /* Measure maximum peak amplitude. */
    max = 0;
    average = 0.0;
    for( i=0; i<numSamples; i++ )
    {
        val = data.recordedSamples[i];
        if( val < 0 ) val = -val; /* ABS */
        if( val > max )
        {
            max = val;
        }
        average += val;
    }

    average = average / (double)numSamples;

    printf("sample max amplitude = "PRINTF_S_FORMAT"\n", max );
    printf("sample average = %lf\n", average );

    /* Write recorded data to a file. */
#if WRITE_TO_FILE
    {
        FILE  *fid;
        fid = fopen("recorded.raw", "wb");
        if( fid == NULL )
        {
            printf("Could not open file.");
        }
        else
        {
            fwrite( data.recordedSamples, NUM_CHANNELS * sizeof(SAMPLE), totalFrames, fid );
            fclose( fid );
            printf("Wrote data to 'recorded.raw'\n");
        }
    }
#endif

    /* Playback recorded data.  -------------------------------------------- */
    data.frameIndex = 0;

    outputParameters.device = Pa_GetDefaultOutputDevice(); /* default output device */
    if (outputParameters.device == paNoDevice) {
        fprintf(stderr,"Error: No default output device.\n");
        goto done;
    }
    outputParameters.channelCount = 2;                     /* stereo output */
    outputParameters.sampleFormat =  PA_SAMPLE_TYPE;
    outputParameters.suggestedLatency = Pa_GetDeviceInfo( outputParameters.device )->defaultLowOutputLatency;
    outputParameters.hostApiSpecificStreamInfo = NULL;

    printf("\n=== Now playing back. ===\n"); fflush(stdout);
    err = Pa_OpenStream(
              &stream,
              NULL, /* no input */
              &outputParameters,
              SAMPLE_RATE,
              FRAMES_PER_BUFFER,
              paClipOff,      /* we won't output out of range samples so don't bother clipping them */
              playCallback,
              &data );
    if( err != paNoError ) goto done;

    if( stream )
    {
        err = Pa_StartStream( stream );
        if( err != paNoError ) goto done;
        
        printf("Waiting for playback to finish.\n"); fflush(stdout);

        while( ( err = Pa_IsStreamActive( stream ) ) == 1 ) Pa_Sleep(100);
        if( err < 0 ) goto done;
        
        err = Pa_CloseStream( stream );
        if( err != paNoError ) goto done;
        
        printf("Done.\n"); fflush(stdout);
    }

done:
    Pa_Terminate();
    if( data.recordedSamples )       /* Sure it is NULL or valid. */
        free( data.recordedSamples );
    if( err != paNoError )
    {
        fprintf( stderr, "An error occured while using the portaudio stream\n" );
        fprintf( stderr, "Error number: %d\n", err );
        fprintf( stderr, "Error message: %s\n", Pa_GetErrorText( err ) );
        err = 1;          /* Always return 0 or 1, but no other return codes. */
    }
    return err;
}